

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderDiscardTests.cpp
# Opt level: O3

void deqp::gles2::Functional::evalDiscardTexture(ShaderEvalContext *c)

{
  undefined8 uVar1;
  long lVar2;
  Vector<float,_2> res;
  float afStack_40 [2];
  undefined8 local_38;
  float local_30;
  float local_28;
  float local_20;
  float fStack_1c;
  float local_18;
  
  local_38 = *(undefined8 *)(c->coords).m_data;
  local_30 = (c->coords).m_data[2];
  local_20 = 0.0;
  fStack_1c = 1.4013e-45;
  local_18 = 2.8026e-45;
  lVar2 = 2;
  do {
    (c->color).m_data[*(int *)((long)&stack0xffffffffffffffd8 + lVar2 * 4)] = afStack_40[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  uVar1 = *(undefined8 *)(c->coords).m_data;
  local_38 = CONCAT44((float)((ulong)uVar1 >> 0x20) * 0.25 + 0.5,(float)uVar1 * 0.25 + 0.5);
  afStack_40[0] = 2.1839513e-38;
  afStack_40[1] = 0.0;
  deqp::gls::ShaderEvalContext::texture2D
            ((ShaderEvalContext *)&stack0xffffffffffffffd8,(int)c,(Vec2 *)0x0);
  if (local_28 < 0.7) {
    c->isDiscarded = true;
  }
  return;
}

Assistant:

inline void evalDiscardTexture (ShaderEvalContext& c)
{
	c.color.xyz() = c.coords.swizzle(0,1,2);
	if (c.texture2D(0, c.coords.swizzle(0,1) * 0.25f + 0.5f).x() < 0.7f)
		c.discard();
}